

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManSimplifyAnd(Vec_Int_t *vSuper)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = vSuper->nSize;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar1 = 0;
  }
  else {
    piVar2 = vSuper->pArray;
    lVar3 = 0;
    uVar6 = 0xffffffff;
    uVar1 = 0;
    do {
      uVar4 = piVar2[lVar3];
      if (uVar4 != 1) {
        if (uVar4 == 0) {
LAB_0076cc8d:
          if (vSuper->nCap < 1) {
            if (piVar2 == (int *)0x0) {
              piVar2 = (int *)malloc(4);
            }
            else {
              piVar2 = (int *)realloc(piVar2,4);
            }
            vSuper->pArray = piVar2;
            if (piVar2 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vSuper->nCap = 1;
          }
          *vSuper->pArray = 0;
          vSuper->nSize = 1;
          return;
        }
        if (uVar6 != 0xffffffff) {
          if (((int)uVar6 < 0) || ((int)uVar4 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          if ((uVar4 ^ uVar6) < 2) {
            if (uVar6 != uVar4) goto LAB_0076cc8d;
            goto LAB_0076cc60;
          }
        }
        if (((int)uVar1 < 0) || ((int)uVar5 <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar1;
        uVar1 = uVar1 + 1;
        piVar2[uVar5] = uVar4;
        uVar6 = uVar4;
      }
LAB_0076cc60:
      lVar3 = lVar3 + 1;
      uVar4 = vSuper->nSize;
      uVar5 = (ulong)(int)uVar4;
    } while (lVar3 < (long)uVar5);
  }
  if ((int)uVar4 < (int)uVar1) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vSuper->nSize = uVar1;
  if (uVar1 != 0) {
    return;
  }
  Vec_IntPush(vSuper,1);
  return;
}

Assistant:

void Gia_ManSimplifyAnd( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            { Vec_IntFill(vSuper, 1, 0); return; }
        if ( This == 1 )
            continue;
        if ( Prev == -1 || Abc_Lit2Var(Prev) != Abc_Lit2Var(This) )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else if ( Prev != This )
            { Vec_IntFill(vSuper, 1, 0); return; }
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, 1 );
}